

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O0

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  uint64_t uVar1;
  int in_ECX;
  block *in_RDX;
  block *in_RDI;
  uint i;
  block block_tmp;
  block blockR;
  undefined4 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  uint uVar2;
  block *in_stack_fffffffffffff7e0;
  block local_420;
  int local_1c;
  block *local_18;
  block *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  rxa2_copy_block(in_stack_fffffffffffff7e0,
                  (block *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
  rxa2_xor_block(&local_420,local_8);
  rxa2_copy_block(in_stack_fffffffffffff7e0,
                  (block *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
  if (local_1c != 0) {
    rxa2_xor_block((block *)&stack0xfffffffffffff7e0,local_18);
  }
  for (uVar2 = 0; uVar2 < 8; uVar2 = uVar2 + 1) {
    uVar1 = fBlaMka(local_420.v[uVar2 << 4],local_420.v[uVar2 * 0x10 + 4]);
    local_420.v[uVar2 << 4] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xc] ^ local_420.v[uVar2 << 4],0x20);
    local_420.v[uVar2 * 0x10 + 0xc] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 8],local_420.v[uVar2 * 0x10 + 0xc]);
    local_420.v[uVar2 * 0x10 + 8] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 4] ^ local_420.v[uVar2 * 0x10 + 8],0x18);
    local_420.v[uVar2 * 0x10 + 4] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 << 4],local_420.v[uVar2 * 0x10 + 4]);
    local_420.v[uVar2 << 4] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xc] ^ local_420.v[uVar2 << 4],0x10);
    local_420.v[uVar2 * 0x10 + 0xc] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 8],local_420.v[uVar2 * 0x10 + 0xc]);
    local_420.v[uVar2 * 0x10 + 8] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 4] ^ local_420.v[uVar2 * 0x10 + 8],0x3f);
    local_420.v[uVar2 * 0x10 + 4] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 1],local_420.v[uVar2 * 0x10 + 5]);
    local_420.v[uVar2 * 0x10 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xd] ^ local_420.v[uVar2 * 0x10 + 1],0x20);
    local_420.v[uVar2 * 0x10 + 0xd] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 9],local_420.v[uVar2 * 0x10 + 0xd]);
    local_420.v[uVar2 * 0x10 + 9] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 5] ^ local_420.v[uVar2 * 0x10 + 9],0x18);
    local_420.v[uVar2 * 0x10 + 5] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 1],local_420.v[uVar2 * 0x10 + 5]);
    local_420.v[uVar2 * 0x10 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xd] ^ local_420.v[uVar2 * 0x10 + 1],0x10);
    local_420.v[uVar2 * 0x10 + 0xd] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 9],local_420.v[uVar2 * 0x10 + 0xd]);
    local_420.v[uVar2 * 0x10 + 9] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 5] ^ local_420.v[uVar2 * 0x10 + 9],0x3f);
    local_420.v[uVar2 * 0x10 + 5] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 2],local_420.v[uVar2 * 0x10 + 6]);
    local_420.v[uVar2 * 0x10 + 2] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xe] ^ local_420.v[uVar2 * 0x10 + 2],0x20);
    local_420.v[uVar2 * 0x10 + 0xe] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 10],local_420.v[uVar2 * 0x10 + 0xe]);
    local_420.v[uVar2 * 0x10 + 10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 6] ^ local_420.v[uVar2 * 0x10 + 10],0x18);
    local_420.v[uVar2 * 0x10 + 6] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 2],local_420.v[uVar2 * 0x10 + 6]);
    local_420.v[uVar2 * 0x10 + 2] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xe] ^ local_420.v[uVar2 * 0x10 + 2],0x10);
    local_420.v[uVar2 * 0x10 + 0xe] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 10],local_420.v[uVar2 * 0x10 + 0xe]);
    local_420.v[uVar2 * 0x10 + 10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 6] ^ local_420.v[uVar2 * 0x10 + 10],0x3f);
    local_420.v[uVar2 * 0x10 + 6] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 3],local_420.v[uVar2 * 0x10 + 7]);
    local_420.v[uVar2 * 0x10 + 3] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xf] ^ local_420.v[uVar2 * 0x10 + 3],0x20);
    local_420.v[uVar2 * 0x10 + 0xf] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 0xb],local_420.v[uVar2 * 0x10 + 0xf]);
    local_420.v[uVar2 * 0x10 + 0xb] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 7] ^ local_420.v[uVar2 * 0x10 + 0xb],0x18);
    local_420.v[uVar2 * 0x10 + 7] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 3],local_420.v[uVar2 * 0x10 + 7]);
    local_420.v[uVar2 * 0x10 + 3] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xf] ^ local_420.v[uVar2 * 0x10 + 3],0x10);
    local_420.v[uVar2 * 0x10 + 0xf] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 0xb],local_420.v[uVar2 * 0x10 + 0xf]);
    local_420.v[uVar2 * 0x10 + 0xb] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 7] ^ local_420.v[uVar2 * 0x10 + 0xb],0x3f);
    local_420.v[uVar2 * 0x10 + 7] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 << 4],local_420.v[uVar2 * 0x10 + 5]);
    local_420.v[uVar2 << 4] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xf] ^ local_420.v[uVar2 << 4],0x20);
    local_420.v[uVar2 * 0x10 + 0xf] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 10],local_420.v[uVar2 * 0x10 + 0xf]);
    local_420.v[uVar2 * 0x10 + 10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 5] ^ local_420.v[uVar2 * 0x10 + 10],0x18);
    local_420.v[uVar2 * 0x10 + 5] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 << 4],local_420.v[uVar2 * 0x10 + 5]);
    local_420.v[uVar2 << 4] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xf] ^ local_420.v[uVar2 << 4],0x10);
    local_420.v[uVar2 * 0x10 + 0xf] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 10],local_420.v[uVar2 * 0x10 + 0xf]);
    local_420.v[uVar2 * 0x10 + 10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 5] ^ local_420.v[uVar2 * 0x10 + 10],0x3f);
    local_420.v[uVar2 * 0x10 + 5] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 1],local_420.v[uVar2 * 0x10 + 6]);
    local_420.v[uVar2 * 0x10 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xc] ^ local_420.v[uVar2 * 0x10 + 1],0x20);
    local_420.v[uVar2 * 0x10 + 0xc] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 0xb],local_420.v[uVar2 * 0x10 + 0xc]);
    local_420.v[uVar2 * 0x10 + 0xb] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 6] ^ local_420.v[uVar2 * 0x10 + 0xb],0x18);
    local_420.v[uVar2 * 0x10 + 6] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 1],local_420.v[uVar2 * 0x10 + 6]);
    local_420.v[uVar2 * 0x10 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xc] ^ local_420.v[uVar2 * 0x10 + 1],0x10);
    local_420.v[uVar2 * 0x10 + 0xc] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 0xb],local_420.v[uVar2 * 0x10 + 0xc]);
    local_420.v[uVar2 * 0x10 + 0xb] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 6] ^ local_420.v[uVar2 * 0x10 + 0xb],0x3f);
    local_420.v[uVar2 * 0x10 + 6] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 2],local_420.v[uVar2 * 0x10 + 7]);
    local_420.v[uVar2 * 0x10 + 2] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xd] ^ local_420.v[uVar2 * 0x10 + 2],0x20);
    local_420.v[uVar2 * 0x10 + 0xd] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 8],local_420.v[uVar2 * 0x10 + 0xd]);
    local_420.v[uVar2 * 0x10 + 8] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 7] ^ local_420.v[uVar2 * 0x10 + 8],0x18);
    local_420.v[uVar2 * 0x10 + 7] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 2],local_420.v[uVar2 * 0x10 + 7]);
    local_420.v[uVar2 * 0x10 + 2] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xd] ^ local_420.v[uVar2 * 0x10 + 2],0x10);
    local_420.v[uVar2 * 0x10 + 0xd] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 8],local_420.v[uVar2 * 0x10 + 0xd]);
    local_420.v[uVar2 * 0x10 + 8] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 7] ^ local_420.v[uVar2 * 0x10 + 8],0x3f);
    local_420.v[uVar2 * 0x10 + 7] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 3],local_420.v[uVar2 * 0x10 + 4]);
    local_420.v[uVar2 * 0x10 + 3] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xe] ^ local_420.v[uVar2 * 0x10 + 3],0x20);
    local_420.v[uVar2 * 0x10 + 0xe] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 9],local_420.v[uVar2 * 0x10 + 0xe]);
    local_420.v[uVar2 * 0x10 + 9] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 4] ^ local_420.v[uVar2 * 0x10 + 9],0x18);
    local_420.v[uVar2 * 0x10 + 4] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 3],local_420.v[uVar2 * 0x10 + 4]);
    local_420.v[uVar2 * 0x10 + 3] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 0xe] ^ local_420.v[uVar2 * 0x10 + 3],0x10);
    local_420.v[uVar2 * 0x10 + 0xe] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 0x10 + 9],local_420.v[uVar2 * 0x10 + 0xe]);
    local_420.v[uVar2 * 0x10 + 9] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 0x10 + 4] ^ local_420.v[uVar2 * 0x10 + 9],0x3f);
    local_420.v[uVar2 * 0x10 + 4] = uVar1;
  }
  for (uVar2 = 0; uVar2 < 8; uVar2 = uVar2 + 1) {
    uVar1 = fBlaMka(local_420.v[uVar2 << 1],local_420.v[uVar2 * 2 + 0x20]);
    local_420.v[uVar2 << 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x60] ^ local_420.v[uVar2 << 1],0x20);
    local_420.v[uVar2 * 2 + 0x60] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x40],local_420.v[uVar2 * 2 + 0x60]);
    local_420.v[uVar2 * 2 + 0x40] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x20] ^ local_420.v[uVar2 * 2 + 0x40],0x18);
    local_420.v[uVar2 * 2 + 0x20] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 << 1],local_420.v[uVar2 * 2 + 0x20]);
    local_420.v[uVar2 << 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x60] ^ local_420.v[uVar2 << 1],0x10);
    local_420.v[uVar2 * 2 + 0x60] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x40],local_420.v[uVar2 * 2 + 0x60]);
    local_420.v[uVar2 * 2 + 0x40] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x20] ^ local_420.v[uVar2 * 2 + 0x40],0x3f);
    local_420.v[uVar2 * 2 + 0x20] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 1],local_420.v[uVar2 * 2 + 0x21]);
    local_420.v[uVar2 * 2 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x61] ^ local_420.v[uVar2 * 2 + 1],0x20);
    local_420.v[uVar2 * 2 + 0x61] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x41],local_420.v[uVar2 * 2 + 0x61]);
    local_420.v[uVar2 * 2 + 0x41] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x21] ^ local_420.v[uVar2 * 2 + 0x41],0x18);
    local_420.v[uVar2 * 2 + 0x21] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 1],local_420.v[uVar2 * 2 + 0x21]);
    local_420.v[uVar2 * 2 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x61] ^ local_420.v[uVar2 * 2 + 1],0x10);
    local_420.v[uVar2 * 2 + 0x61] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x41],local_420.v[uVar2 * 2 + 0x61]);
    local_420.v[uVar2 * 2 + 0x41] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x21] ^ local_420.v[uVar2 * 2 + 0x41],0x3f);
    local_420.v[uVar2 * 2 + 0x21] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x10],local_420.v[uVar2 * 2 + 0x30]);
    local_420.v[uVar2 * 2 + 0x10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x70] ^ local_420.v[uVar2 * 2 + 0x10],0x20);
    local_420.v[uVar2 * 2 + 0x70] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x50],local_420.v[uVar2 * 2 + 0x70]);
    local_420.v[uVar2 * 2 + 0x50] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x30] ^ local_420.v[uVar2 * 2 + 0x50],0x18);
    local_420.v[uVar2 * 2 + 0x30] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x10],local_420.v[uVar2 * 2 + 0x30]);
    local_420.v[uVar2 * 2 + 0x10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x70] ^ local_420.v[uVar2 * 2 + 0x10],0x10);
    local_420.v[uVar2 * 2 + 0x70] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x50],local_420.v[uVar2 * 2 + 0x70]);
    local_420.v[uVar2 * 2 + 0x50] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x30] ^ local_420.v[uVar2 * 2 + 0x50],0x3f);
    local_420.v[uVar2 * 2 + 0x30] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x11],local_420.v[uVar2 * 2 + 0x31]);
    local_420.v[uVar2 * 2 + 0x11] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x71] ^ local_420.v[uVar2 * 2 + 0x11],0x20);
    local_420.v[uVar2 * 2 + 0x71] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x51],local_420.v[uVar2 * 2 + 0x71]);
    local_420.v[uVar2 * 2 + 0x51] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x31] ^ local_420.v[uVar2 * 2 + 0x51],0x18);
    local_420.v[uVar2 * 2 + 0x31] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x11],local_420.v[uVar2 * 2 + 0x31]);
    local_420.v[uVar2 * 2 + 0x11] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x71] ^ local_420.v[uVar2 * 2 + 0x11],0x10);
    local_420.v[uVar2 * 2 + 0x71] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x51],local_420.v[uVar2 * 2 + 0x71]);
    local_420.v[uVar2 * 2 + 0x51] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x31] ^ local_420.v[uVar2 * 2 + 0x51],0x3f);
    local_420.v[uVar2 * 2 + 0x31] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 << 1],local_420.v[uVar2 * 2 + 0x21]);
    local_420.v[uVar2 << 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x71] ^ local_420.v[uVar2 << 1],0x20);
    local_420.v[uVar2 * 2 + 0x71] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x50],local_420.v[uVar2 * 2 + 0x71]);
    local_420.v[uVar2 * 2 + 0x50] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x21] ^ local_420.v[uVar2 * 2 + 0x50],0x18);
    local_420.v[uVar2 * 2 + 0x21] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 << 1],local_420.v[uVar2 * 2 + 0x21]);
    local_420.v[uVar2 << 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x71] ^ local_420.v[uVar2 << 1],0x10);
    local_420.v[uVar2 * 2 + 0x71] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x50],local_420.v[uVar2 * 2 + 0x71]);
    local_420.v[uVar2 * 2 + 0x50] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x21] ^ local_420.v[uVar2 * 2 + 0x50],0x3f);
    local_420.v[uVar2 * 2 + 0x21] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 1],local_420.v[uVar2 * 2 + 0x30]);
    local_420.v[uVar2 * 2 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x60] ^ local_420.v[uVar2 * 2 + 1],0x20);
    local_420.v[uVar2 * 2 + 0x60] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x51],local_420.v[uVar2 * 2 + 0x60]);
    local_420.v[uVar2 * 2 + 0x51] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x30] ^ local_420.v[uVar2 * 2 + 0x51],0x18);
    local_420.v[uVar2 * 2 + 0x30] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 1],local_420.v[uVar2 * 2 + 0x30]);
    local_420.v[uVar2 * 2 + 1] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x60] ^ local_420.v[uVar2 * 2 + 1],0x10);
    local_420.v[uVar2 * 2 + 0x60] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x51],local_420.v[uVar2 * 2 + 0x60]);
    local_420.v[uVar2 * 2 + 0x51] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x30] ^ local_420.v[uVar2 * 2 + 0x51],0x3f);
    local_420.v[uVar2 * 2 + 0x30] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x10],local_420.v[uVar2 * 2 + 0x31]);
    local_420.v[uVar2 * 2 + 0x10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x61] ^ local_420.v[uVar2 * 2 + 0x10],0x20);
    local_420.v[uVar2 * 2 + 0x61] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x40],local_420.v[uVar2 * 2 + 0x61]);
    local_420.v[uVar2 * 2 + 0x40] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x31] ^ local_420.v[uVar2 * 2 + 0x40],0x18);
    local_420.v[uVar2 * 2 + 0x31] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x10],local_420.v[uVar2 * 2 + 0x31]);
    local_420.v[uVar2 * 2 + 0x10] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x61] ^ local_420.v[uVar2 * 2 + 0x10],0x10);
    local_420.v[uVar2 * 2 + 0x61] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x40],local_420.v[uVar2 * 2 + 0x61]);
    local_420.v[uVar2 * 2 + 0x40] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x31] ^ local_420.v[uVar2 * 2 + 0x40],0x3f);
    local_420.v[uVar2 * 2 + 0x31] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x11],local_420.v[uVar2 * 2 + 0x20]);
    local_420.v[uVar2 * 2 + 0x11] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x70] ^ local_420.v[uVar2 * 2 + 0x11],0x20);
    local_420.v[uVar2 * 2 + 0x70] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x41],local_420.v[uVar2 * 2 + 0x70]);
    local_420.v[uVar2 * 2 + 0x41] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x20] ^ local_420.v[uVar2 * 2 + 0x41],0x18);
    local_420.v[uVar2 * 2 + 0x20] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x11],local_420.v[uVar2 * 2 + 0x20]);
    local_420.v[uVar2 * 2 + 0x11] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x70] ^ local_420.v[uVar2 * 2 + 0x11],0x10);
    local_420.v[uVar2 * 2 + 0x70] = uVar1;
    uVar1 = fBlaMka(local_420.v[uVar2 * 2 + 0x41],local_420.v[uVar2 * 2 + 0x70]);
    local_420.v[uVar2 * 2 + 0x41] = uVar1;
    uVar1 = rotr64(local_420.v[uVar2 * 2 + 0x20] ^ local_420.v[uVar2 * 2 + 0x41],0x3f);
    local_420.v[uVar2 * 2 + 0x20] = uVar1;
  }
  rxa2_copy_block(in_stack_fffffffffffff7e0,(block *)CONCAT44(uVar2,in_stack_fffffffffffff7d8));
  rxa2_xor_block(local_18,&local_420);
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
	block *next_block, int with_xor) {
	block blockR, block_tmp;
	unsigned i;

	rxa2_copy_block(&blockR, ref_block);
	rxa2_xor_block(&blockR, prev_block);
	rxa2_copy_block(&block_tmp, &blockR);
	/* Now blockR = ref_block + prev_block and block_tmp = ref_block + prev_block */
	if (with_xor) {
		/* Saving the next block contents for XOR over: */
		rxa2_xor_block(&block_tmp, next_block);
		/* Now blockR = ref_block + prev_block and
		   block_tmp = ref_block + prev_block + next_block */
	}

	/* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
	   (16,17,..31)... finally (112,113,...127) */
	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[16 * i], blockR.v[16 * i + 1], blockR.v[16 * i + 2],
			blockR.v[16 * i + 3], blockR.v[16 * i + 4], blockR.v[16 * i + 5],
			blockR.v[16 * i + 6], blockR.v[16 * i + 7], blockR.v[16 * i + 8],
			blockR.v[16 * i + 9], blockR.v[16 * i + 10], blockR.v[16 * i + 11],
			blockR.v[16 * i + 12], blockR.v[16 * i + 13], blockR.v[16 * i + 14],
			blockR.v[16 * i + 15]);
	}

	/* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
	   (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
	for (i = 0; i < 8; i++) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[2 * i], blockR.v[2 * i + 1], blockR.v[2 * i + 16],
			blockR.v[2 * i + 17], blockR.v[2 * i + 32], blockR.v[2 * i + 33],
			blockR.v[2 * i + 48], blockR.v[2 * i + 49], blockR.v[2 * i + 64],
			blockR.v[2 * i + 65], blockR.v[2 * i + 80], blockR.v[2 * i + 81],
			blockR.v[2 * i + 96], blockR.v[2 * i + 97], blockR.v[2 * i + 112],
			blockR.v[2 * i + 113]);
	}

	rxa2_copy_block(next_block, &block_tmp);
	rxa2_xor_block(next_block, &blockR);
}